

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  long lVar2;
  cmMakefile *this_00;
  bool bVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  pointer pbVar7;
  char *__s;
  cmInstallScriptGenerator *pcVar8;
  cmGlobalGenerator *this_01;
  int iVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  string script;
  string component;
  string local_a0;
  cmInstallCommand *local_80;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  cmMakefile *local_38;
  
  local_78[0] = local_68;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_80 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar7) {
LAB_00320f18:
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar13 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish == pbVar7;
    bVar12 = !bVar13;
    if (bVar13) {
      bVar3 = false;
      bVar13 = false;
    }
    else {
      lVar10 = 0;
      uVar11 = 0;
      bVar3 = false;
      bVar13 = false;
      do {
        iVar9 = std::__cxx11::string::compare((char *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10));
        if (iVar9 == 0) {
          bVar13 = true;
LAB_0032111b:
          bVar3 = false;
        }
        else {
          iVar9 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar10));
          if (iVar9 == 0) {
            bVar3 = true;
            bVar13 = false;
          }
          else {
            iVar9 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar10));
            if (iVar9 == 0) {
              bVar13 = false;
              goto LAB_0032111b;
            }
            if (bVar13) {
              pbVar7 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              lVar2 = *(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,lVar2,
                         *(long *)((long)&pbVar7->_M_string_length + lVar10) + lVar2);
              bVar13 = cmsys::SystemTools::FileIsFullPath(local_a0._M_dataplus._M_p);
              if (!bVar13) {
                __s = cmMakefile::GetCurrentSourceDirectory((local_80->super_cmCommand).Makefile);
                sVar4 = local_a0._M_string_length;
                strlen(__s);
                std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)sVar4,(ulong)__s);
                std::__cxx11::string::append((char *)&local_a0);
                std::__cxx11::string::_M_append
                          ((char *)&local_a0,
                           *(ulong *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar10));
              }
              bVar5 = cmsys::SystemTools::FileIsDirectory(&local_a0);
              if (bVar5) {
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,"given a directory as value of SCRIPT argument.","");
                cmCommand::SetError(&local_80->super_cmCommand,&local_58);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                local_38 = (local_80->super_cmCommand).Makefile;
                pcVar8 = (cmInstallScriptGenerator *)operator_new(0xe0);
                cmInstallScriptGenerator::cmInstallScriptGenerator
                          (pcVar8,local_a0._M_dataplus._M_p,false,(char *)local_78[0]);
                cmMakefile::AddInstallGenerator(local_38,(cmInstallGenerator *)pcVar8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar13 = false;
              if (bVar5) break;
            }
            else if (bVar3) {
              pbVar7 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              lVar2 = *(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,lVar2,
                         *(long *)((long)&pbVar7->_M_string_length + lVar10) + lVar2);
              this_00 = (local_80->super_cmCommand).Makefile;
              pcVar8 = (cmInstallScriptGenerator *)operator_new(0xe0);
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar8,local_a0._M_dataplus._M_p,true,(char *)local_78[0]);
              cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)pcVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_0032111b;
            }
          }
        }
        uVar11 = uVar11 + 1;
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x20;
        bVar12 = uVar11 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7
                                 >> 5);
      } while (bVar12);
    }
    if (!bVar12) {
      if (bVar13) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"given no value for SCRIPT argument.","");
        cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
      }
      else {
        if (!bVar3) {
          this_01 = cmMakefile::GetGlobalGenerator((local_80->super_cmCommand).Makefile);
          bVar12 = true;
          cmGlobalGenerator::AddInstallComponent(this_01,(char *)local_78[0]);
          goto LAB_00321248;
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"given no value for CODE argument.","");
        cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
      }
      goto LAB_0032122f;
    }
  }
  else {
    uVar11 = 0;
    iVar9 = 0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)(pbVar7 + uVar11));
      if ((iVar6 == 0) &&
         (uVar11 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)local_78);
        iVar9 = iVar9 + 1;
        uVar11 = uVar11 + 1;
      }
      uVar11 = uVar11 + 1;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)
            );
    if (iVar9 < 2) goto LAB_00320f18;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
LAB_0032122f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar12 = false;
LAB_00321248:
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return bVar12;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMPONENT" && i+1 < args.size())
        {
        ++componentCount;
        ++i;
        component = args[i];
        }
    }

  if(componentCount>1)
    {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
      "signature of the INSTALL command. "
      "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
    }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "SCRIPT")
      {
      doing_script = true;
      doing_code = false;
      }
    else if(args[i] == "CODE")
      {
      doing_script = false;
      doing_code = true;
      }
    else if(args[i] == "COMPONENT")
      {
      doing_script = false;
      doing_code = false;
      }
    else if(doing_script)
      {
      doing_script = false;
      std::string script = args[i];
      if(!cmSystemTools::FileIsFullPath(script.c_str()))
        {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += args[i];
        }
      if(cmSystemTools::FileIsDirectory(script))
        {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
        }
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(script.c_str(), false,
                                     component.c_str()));
      }
    else if(doing_code)
      {
      doing_code = false;
      std::string code = args[i];
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(code.c_str(), true,
                                     component.c_str()));
      }
    }

  if(doing_script)
    {
    this->SetError("given no value for SCRIPT argument.");
    return false;
    }
  if(doing_code)
    {
    this->SetError("given no value for CODE argument.");
    return false;
    }

  //Tell the global generator about any installation component names specified.
  this->Makefile->GetGlobalGenerator()
                             ->AddInstallComponent(component.c_str());

  return true;
}